

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O3

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::expand_
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this)

{
  uint64_t key;
  pointer psVar1;
  pointer psVar2;
  ulong uVar3;
  long lVar4;
  this_type new_ht;
  undefined1 local_58 [16];
  pointer local_48;
  uint64_t local_40;
  uint64_t uStack_38;
  size_p2 sStack_30;
  
  standard_hash_table((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)local_58,
                      (this->capa_size_).bits_ + 1);
  psVar2 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 != psVar2) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      key = *(uint64_t *)((long)psVar2 + lVar4 + -8);
      if (key != 0xffffffffffffffff) {
        set((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)local_58,key,
            *(uint64_t *)((long)&psVar2->key + lVar4));
        psVar2 = (this->table_).
                 super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (this->table_).
                 super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)psVar1 - (long)psVar2 >> 4));
  }
  psVar1 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->table_).
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  (this->table_).
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  local_58 = ZEXT816(0) << 0x20;
  (this->table_).
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  local_48 = (pointer)0x0;
  if (psVar2 == (pointer)0x0) {
    this->size_ = local_40;
    this->max_size_ = uStack_38;
    (this->capa_size_).bits_ = sStack_30.bits_;
    *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_30._4_4_;
    (this->capa_size_).mask_ = sStack_30.mask_;
  }
  else {
    operator_delete(psVar2,(long)psVar1 - (long)psVar2);
    this->size_ = local_40;
    this->max_size_ = uStack_38;
    (this->capa_size_).bits_ = sStack_30.bits_;
    *(undefined4 *)&(this->capa_size_).field_0x4 = sStack_30._4_4_;
    (this->capa_size_).mask_ = sStack_30.mask_;
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
    }
  }
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < table_.size(); ++i) {
            if (table_[i].key != UINT64_MAX) {
                new_ht.set(table_[i].key, table_[i].val);
            }
        }

        assert(size() == new_ht.size());
        *this = std::move(new_ht);
    }